

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tv_ctrlpt.c
# Opt level: O3

int TvCtrlPointDeleteNode(TvDeviceNode *node)

{
  bool bVar1;
  char cVar2;
  uint uVar3;
  bool bVar4;
  int iVar5;
  char *pcVar6;
  long lVar7;
  long lVar8;
  
  if (node == (TvDeviceNode *)0x0) {
    SampleUtil_Print("ERROR: TvCtrlPointDeleteNode: Node is empty\n");
    iVar5 = -1;
  }
  else {
    lVar8 = 0;
    bVar1 = true;
    do {
      bVar4 = bVar1;
      if ((node->device).TvService[lVar8].SID[0] != '\0') {
        pcVar6 = (node->device).TvService[lVar8].SID;
        uVar3 = UpnpUnSubscribe(ctrlpt_handle,pcVar6);
        if (uVar3 == 0) {
          SampleUtil_Print("Unsubscribed from Tv %s EventURL with SID=%s\n",TvServiceName[lVar8],
                           pcVar6);
        }
        else {
          SampleUtil_Print("Error unsubscribing to Tv %s EventURL -- %d\n",TvServiceName[lVar8],
                           (ulong)uVar3);
        }
      }
      cVar2 = TvVarCount[lVar8];
      if ('\0' < cVar2) {
        lVar7 = 0;
        do {
          pcVar6 = (node->device).TvService[lVar8].VariableStrVal[lVar7];
          if (pcVar6 != (char *)0x0) {
            free(pcVar6);
            cVar2 = TvVarCount[lVar8];
          }
          lVar7 = lVar7 + 1;
        } while (lVar7 < cVar2);
      }
      lVar8 = 1;
      iVar5 = 0;
      bVar1 = false;
    } while (bVar4);
    SampleUtil_StateUpdate((char *)0x0,(char *)0x0,(char *)node,DEVICE_REMOVED);
    free(node);
  }
  return iVar5;
}

Assistant:

int TvCtrlPointDeleteNode(struct TvDeviceNode *node)
{
	int rc, service, var;

	if (NULL == node) {
		SampleUtil_Print(
			"ERROR: TvCtrlPointDeleteNode: Node is empty\n");
		return TV_ERROR;
	}

	for (service = 0; service < TV_SERVICE_SERVCOUNT; service++) {
		/*
		   If we have a valid control SID, then unsubscribe
		 */
		if (strcmp(node->device.TvService[service].SID, "") != 0) {
			rc = UpnpUnSubscribe(ctrlpt_handle,
				node->device.TvService[service].SID);
			if (UPNP_E_SUCCESS == rc) {
				SampleUtil_Print("Unsubscribed from Tv %s "
						 "EventURL with SID=%s\n",
					TvServiceName[service],
					node->device.TvService[service].SID);
			} else {
				SampleUtil_Print("Error unsubscribing to Tv %s "
						 "EventURL -- %d\n",
					TvServiceName[service],
					rc);
			}
		}

		for (var = 0; var < TvVarCount[service]; var++) {
			if (node->device.TvService[service]
					.VariableStrVal[var]) {
				free(node->device.TvService[service]
						.VariableStrVal[var]);
			}
		}
	}

	/*Notify New Device Added */
	SampleUtil_StateUpdate(NULL, NULL, node->device.UDN, DEVICE_REMOVED);
	free(node);
	node = NULL;

	return TV_SUCCESS;
}